

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

void __thiscall cmELF::~cmELF(cmELF *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->Internal != (cmELFInternal *)0x0) {
    (*this->Internal->_vptr_cmELFInternal[1])();
  }
  pcVar1 = (this->ErrorMessage)._M_dataplus._M_p;
  paVar2 = &(this->ErrorMessage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmELF::~cmELF()
{
  delete this->Internal;
}